

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

s32 __thiscall
irr::core::string<unsigned_long>::findNext(string<unsigned_long> *this,unsigned_long c,s32 startPos)

{
  long lVar1;
  s32 i;
  
  lVar1 = (long)startPos;
  while( true ) {
    if (this->used <= lVar1) {
      return -1;
    }
    if (this->array[lVar1] == c) break;
    lVar1 = lVar1 + 1;
  }
  return (s32)lVar1;
}

Assistant:

s32 findNext(T c, s32 startPos) const
	{
		for (s32 i=startPos; i<used; ++i)
			if (array[i] == c)
				return i;

		return -1;
	}